

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall
helics::CommonCore::setLoggingCallback
          (CommonCore *this,LocalFederateId federateID,
          function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
          *logFunction)

{
  atomic<unsigned_short> *paVar1;
  _Manager_type p_Var2;
  uint16_t exp;
  ushort uVar3;
  ushort uVar4;
  FederateState *this_00;
  InvalidIdentifier *this_01;
  ushort uVar5;
  bool bVar6;
  string_view message;
  ActionMessage loggerUpdate;
  _Any_data local_f8;
  _Manager_type local_e8;
  _Invoker_type local_e0;
  ActionMessage local_d8;
  
  if (federateID.fid == -0x103) {
    ActionMessage::ActionMessage(&local_d8,cmd_core_configure);
    local_d8.messageID = 0x250;
    local_d8.source_id.gid = (this->super_BrokerBase).global_id._M_i.gid;
    local_d8.dest_id.gid = (this->super_BrokerBase).global_id._M_i.gid;
    if ((logFunction->super__Function_base)._M_manager == (_Manager_type)0x0) {
      local_d8.flags._1_1_ = local_d8.flags._1_1_ | 0x80;
    }
    else {
      LOCK();
      paVar1 = &this->nextAirLock;
      uVar5 = (paVar1->super___atomic_base<unsigned_short>)._M_i;
      (paVar1->super___atomic_base<unsigned_short>)._M_i =
           (paVar1->super___atomic_base<unsigned_short>)._M_i + 1;
      UNLOCK();
      uVar5 = uVar5 & 3;
      if (uVar5 == 3) {
        uVar3 = 4;
        do {
          LOCK();
          uVar4 = (this->nextAirLock).super___atomic_base<unsigned_short>._M_i;
          bVar6 = uVar3 == uVar4;
          if (bVar6) {
            (this->nextAirLock).super___atomic_base<unsigned_short>._M_i = uVar3 & 3;
            uVar4 = uVar3;
          }
          UNLOCK();
        } while ((!bVar6) && (uVar3 = uVar4, 3 < uVar4));
      }
      gmlc::containers::AirLock<std::any,std::mutex,std::condition_variable>::
      load<std::function<void(int,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>>
                ((AirLock<std::any,std::mutex,std::condition_variable> *)
                 ((this->dataAirlocks)._M_elems + uVar5),logFunction);
      local_d8.counter = uVar5;
    }
    gmlc::containers::
    BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable>::
    push<helics::ActionMessage&>
              ((BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable> *)
               &(this->super_BrokerBase).actionQueue,&local_d8);
    ActionMessage::~ActionMessage(&local_d8);
  }
  else {
    this_00 = getFederateAt(this,federateID);
    if (this_00 == (FederateState *)0x0) {
      this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
      message._M_str = "FederateID is not valid (setLoggingCallback)";
      message._M_len = 0x2c;
      InvalidIdentifier::InvalidIdentifier(this_01,message);
      __cxa_throw(this_01,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
    }
    local_f8._M_unused._M_object = (void *)0x0;
    local_f8._8_8_ = 0;
    local_e8 = (_Manager_type)0x0;
    local_e0 = logFunction->_M_invoker;
    p_Var2 = (logFunction->super__Function_base)._M_manager;
    if (p_Var2 != (_Manager_type)0x0) {
      local_f8._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&(logFunction->super__Function_base)._M_functor;
      local_f8._8_8_ = *(undefined8 *)((long)&(logFunction->super__Function_base)._M_functor + 8);
      (logFunction->super__Function_base)._M_manager = (_Manager_type)0x0;
      logFunction->_M_invoker = (_Invoker_type)0x0;
      local_e8 = p_Var2;
    }
    FederateState::setLogger
              (this_00,(function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                        *)&local_f8);
    if (local_e8 != (_Manager_type)0x0) {
      (*local_e8)((_Any_data *)&local_f8,(_Any_data *)&local_f8,__destroy_functor);
    }
  }
  return;
}

Assistant:

void CommonCore::setLoggingCallback(
    LocalFederateId federateID,
    std::function<void(int, std::string_view, std::string_view)> logFunction)
{
    if (federateID == gLocalCoreId) {
        ActionMessage loggerUpdate(CMD_CORE_CONFIGURE);
        loggerUpdate.messageID = UPDATE_LOGGING_CALLBACK;
        loggerUpdate.source_id = global_id.load();
        loggerUpdate.dest_id = global_id.load();
        if (logFunction) {
            auto index = getNextAirlockIndex();
            dataAirlocks[index].load(std::move(logFunction));
            loggerUpdate.counter = index;
        } else {
            setActionFlag(loggerUpdate, empty_flag);
        }

        actionQueue.push(loggerUpdate);
    } else {
        auto* fed = getFederateAt(federateID);
        if (fed == nullptr) {
            throw(InvalidIdentifier("FederateID is not valid (setLoggingCallback)"));
        }
        fed->setLogger(std::move(logFunction));
    }
}